

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglfskmsgbmintegration.cpp
# Opt level: O2

QKmsDevice * __thiscall QEglFSKmsGbmIntegration::createDevice(QEglFSKmsGbmIntegration *this)

{
  long lVar1;
  QDebug *pQVar2;
  QDeviceDiscovery *pQVar3;
  QEglFSKmsGbmDevice *this_00;
  QKmsScreenConfig *screenConfig;
  long in_FS_OFFSET;
  QDebug local_a0;
  undefined1 local_98 [20];
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  long local_78;
  char local_68 [24];
  char *local_50;
  QArrayDataPointer<char16_t> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = QEglFSKmsIntegration::screenConfig();
  local_48.d = *(Data **)(lVar1 + 8);
  local_48.ptr = *(char16_t **)(lVar1 + 0x10);
  local_48.size = *(long *)(lVar1 + 0x18);
  if (local_48.d != (Data *)0x0) {
    LOCK();
    ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if (local_48.size == 0) {
    pQVar3 = QDeviceDiscovery::create((QDeviceTypes)0x10,(QObject *)0x0);
    local_78 = -0x5555555555555556;
    local_98._16_4_ = 0xaaaaaaaa;
    uStack_84 = 0xaaaaaaaa;
    uStack_80 = 0xaaaaaaaa;
    uStack_7c = 0xaaaaaaaa;
    (**(code **)(*(long *)pQVar3 + 0x60))(local_98 + 0x10,pQVar3);
    lVar1 = QtPrivateLogging::qLcEglfsKmsDebug();
    if ((*(byte *)(lVar1 + 0x10) & 1) != 0) {
      local_50 = *(char **)(lVar1 + 8);
      local_68[0] = '\x02';
      local_68[1] = '\0';
      local_68[2] = '\0';
      local_68[3] = '\0';
      local_68[4] = '\0';
      local_68[5] = '\0';
      local_68[6] = '\0';
      local_68[7] = '\0';
      local_68[8] = '\0';
      local_68[9] = '\0';
      local_68[10] = '\0';
      local_68[0xb] = '\0';
      local_68[0xc] = '\0';
      local_68[0xd] = '\0';
      local_68[0xe] = '\0';
      local_68[0xf] = '\0';
      local_68[0x10] = '\0';
      local_68[0x11] = '\0';
      local_68[0x12] = '\0';
      local_68[0x13] = '\0';
      local_68[0x14] = '\0';
      local_68[0x15] = '\0';
      local_68[0x16] = '\0';
      local_68[0x17] = '\0';
      QMessageLogger::debug();
      pQVar2 = QDebug::operator<<(&local_a0,"Found the following video devices:");
      local_98._0_8_ = pQVar2->stream;
      *(int *)(local_98._0_8_ + 0x28) = *(int *)(local_98._0_8_ + 0x28) + 1;
      ::operator<<((Stream *)(local_98 + 8),(QList<QString> *)local_98);
      QDebug::~QDebug((QDebug *)(local_98 + 8));
      QDebug::~QDebug((QDebug *)local_98);
      QDebug::~QDebug(&local_a0);
    }
    QObject::deleteLater();
    if (local_78 == 0) {
      local_68[0] = '\x02';
      local_68[1] = '\0';
      local_68[2] = '\0';
      local_68[3] = '\0';
      local_68[0x14] = '\0';
      local_68[0x15] = '\0';
      local_68[0x16] = '\0';
      local_68[0x17] = '\0';
      local_68[4] = '\0';
      local_68[5] = '\0';
      local_68[6] = '\0';
      local_68[7] = '\0';
      local_68[8] = '\0';
      local_68[9] = '\0';
      local_68[10] = '\0';
      local_68[0xb] = '\0';
      local_68[0xc] = '\0';
      local_68[0xd] = '\0';
      local_68[0xe] = '\0';
      local_68[0xf] = '\0';
      local_68[0x10] = '\0';
      local_68[0x11] = '\0';
      local_68[0x12] = '\0';
      local_68[0x13] = '\0';
      local_50 = "default";
      QMessageLogger::fatal(local_68,"Could not find DRM device!");
      goto LAB_00111bdb;
    }
    QString::operator=((QString *)&local_48,(QString *)CONCAT44(uStack_7c,uStack_80));
    lVar1 = QtPrivateLogging::qLcEglfsKmsDebug();
    if ((*(byte *)(lVar1 + 0x10) & 1) != 0) {
      local_50 = *(char **)(lVar1 + 8);
      local_68[0] = '\x02';
      local_68[1] = '\0';
      local_68[2] = '\0';
      local_68[3] = '\0';
      local_68[4] = '\0';
      local_68[5] = '\0';
      local_68[6] = '\0';
      local_68[7] = '\0';
      local_68[8] = '\0';
      local_68[9] = '\0';
      local_68[10] = '\0';
      local_68[0xb] = '\0';
      local_68[0xc] = '\0';
      local_68[0xd] = '\0';
      local_68[0xe] = '\0';
      local_68[0xf] = '\0';
      local_68[0x10] = '\0';
      local_68[0x11] = '\0';
      local_68[0x12] = '\0';
      local_68[0x13] = '\0';
      local_68[0x14] = '\0';
      local_68[0x15] = '\0';
      local_68[0x16] = '\0';
      local_68[0x17] = '\0';
      QMessageLogger::debug();
      pQVar2 = QDebug::operator<<(&local_a0,"Using");
      QDebug::operator<<(pQVar2,(QString *)&local_48);
      QDebug::~QDebug(&local_a0);
    }
    QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)(local_98 + 0x10));
  }
  else {
    lVar1 = QtPrivateLogging::qLcEglfsKmsDebug();
    if ((*(byte *)(lVar1 + 0x10) & 1) != 0) {
      local_50 = *(char **)(lVar1 + 8);
      local_68[0] = '\x02';
      local_68[1] = '\0';
      local_68[2] = '\0';
      local_68[3] = '\0';
      local_68[4] = '\0';
      local_68[5] = '\0';
      local_68[6] = '\0';
      local_68[7] = '\0';
      local_68[8] = '\0';
      local_68[9] = '\0';
      local_68[10] = '\0';
      local_68[0xb] = '\0';
      local_68[0xc] = '\0';
      local_68[0xd] = '\0';
      local_68[0xe] = '\0';
      local_68[0xf] = '\0';
      local_68[0x10] = '\0';
      local_68[0x11] = '\0';
      local_68[0x12] = '\0';
      local_68[0x13] = '\0';
      local_68[0x14] = '\0';
      local_68[0x15] = '\0';
      local_68[0x16] = '\0';
      local_68[0x17] = '\0';
      QMessageLogger::debug();
      pQVar2 = QDebug::operator<<((QDebug *)(local_98 + 0x10),"GBM: Using DRM device");
      pQVar2 = QDebug::operator<<(pQVar2,(QString *)&local_48);
      QDebug::operator<<(pQVar2,"specified in config file");
      QDebug::~QDebug((QDebug *)(local_98 + 0x10));
    }
  }
  this_00 = (QEglFSKmsGbmDevice *)operator_new(0x70);
  screenConfig = (QKmsScreenConfig *)QEglFSKmsIntegration::screenConfig();
  QEglFSKmsGbmDevice::QEglFSKmsGbmDevice(this_00,screenConfig,(QString *)&local_48);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (QKmsDevice *)this_00;
  }
LAB_00111bdb:
  __stack_chk_fail();
}

Assistant:

QKmsDevice *QEglFSKmsGbmIntegration::createDevice()
{
    QString path = screenConfig()->devicePath();
    if (!path.isEmpty()) {
        qCDebug(qLcEglfsKmsDebug) << "GBM: Using DRM device" << path << "specified in config file";
    } else {
        QDeviceDiscovery *d = QDeviceDiscovery::create(QDeviceDiscovery::Device_VideoMask);
        const QStringList devices = d->scanConnectedDevices();
        qCDebug(qLcEglfsKmsDebug) << "Found the following video devices:" << devices;
        d->deleteLater();

        if (Q_UNLIKELY(devices.isEmpty()))
            qFatal("Could not find DRM device!");

        path = devices.first();
        qCDebug(qLcEglfsKmsDebug) << "Using" << path;
    }

    return new QEglFSKmsGbmDevice(screenConfig(), path);
}